

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_spell_book_teleport_on_use.hpp
# Opt level: O2

void __thiscall
PatchSpellBookTeleportOnUse::inject_code(PatchSpellBookTeleportOnUse *this,ROM *rom,World *world)

{
  uint32_t uVar1;
  Item *pIVar2;
  string local_c8;
  Param local_a8;
  undefined8 local_a0;
  Code func_pre_use;
  
  func_pre_use._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &func_pre_use._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header;
  func_pre_use._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  func_pre_use._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  func_pre_use._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  func_pre_use._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  func_pre_use._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  func_pre_use._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  func_pre_use._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &func_pre_use._labels._M_t._M_impl.super__Rb_tree_header._M_header;
  func_pre_use._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  func_pre_use._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  func_pre_use._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  func_pre_use._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       func_pre_use._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  func_pre_use._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       func_pre_use._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (this->_consumable_spell_book == true) {
    local_c8._M_string_length._0_1_ = 0;
    local_c8._M_dataplus._M_p = (pointer)&PTR_getXn_00246bf0;
    local_a8._vptr_Param = (_func_int **)&PTR_getXn_00246ce8;
    local_a0 = 0x200ff1152;
    md::Code::moveb(&func_pre_use,(Param *)&local_c8,&local_a8);
    md::Code::jsr(&func_pre_use,0x8b98);
  }
  md::Code::jmp(&func_pre_use,0x8bb2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"",(allocator<char> *)&local_a8);
  uVar1 = md::ROM::inject_code(rom,&func_pre_use,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  pIVar2 = World::item(world,'$');
  (*pIVar2->_vptr_Item[2])(pIVar2,(ulong)uVar1);
  uVar1 = inject_func_warp_to_start(rom,world);
  pIVar2 = World::item(world,'$');
  (*pIVar2->_vptr_Item[3])(pIVar2,(ulong)uVar1);
  md::Code::~Code(&func_pre_use);
  return;
}

Assistant:

void inject_code(md::ROM& rom, World& world) override
    {
        // Replace "consume Spell Book" by a return indicating success and signaling there is a post-use effect
        // to handle.
        md::Code func_pre_use;
        if(_consumable_spell_book)
        {
            func_pre_use.moveb(reg_D0, addr_(0xFF1152));
            func_pre_use.jsr(0x8B98); // ConsumeItem
        }
        func_pre_use.jmp(offsets::PROC_ITEM_USE_RETURN_SUCCESS_HAS_POST_USE);
        uint32_t func_pre_use_addr = rom.inject_code(func_pre_use);
        world.item(ITEM_SPELL_BOOK)->pre_use_address(func_pre_use_addr);

        uint32_t func_warp_to_start = inject_func_warp_to_start(rom, world);
        world.item(ITEM_SPELL_BOOK)->post_use_address(func_warp_to_start);
    }